

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

_Bool ecs_is_component_enabled_w_entity
                (ecs_world_t *world,ecs_entity_t entity,ecs_entity_t component)

{
  int iVar1;
  _Bool _Var2;
  int32_t iVar3;
  uint uVar4;
  ecs_entity_info_t info;
  ecs_entity_info_t local_50;
  
  _Var2 = ecs_get_info(world,entity,&local_50);
  if ((!_Var2) || (local_50.table == (ecs_table_t *)0x0)) {
    return false;
  }
  iVar3 = ecs_type_index_of((local_50.table)->type,component & 0xffffffffffffff | 0xf400000000000000
                           );
  if (iVar3 == -1) {
    _Var2 = ecs_has_entity(world,entity,component);
    return _Var2;
  }
  iVar1 = (local_50.table)->bs_column_offset;
  _ecs_assert(-1 < iVar3 - iVar1,0xc,(char *)0x0,"index >= 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x90f);
  uVar4 = iVar3 - iVar1;
  if (-1 < (int)uVar4) {
    _ecs_assert(local_50.data != (ecs_data_t *)0x0,0xc,(char *)0x0,"info.data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x912);
    if (local_50.data != (ecs_data_t *)0x0) {
      _Var2 = ecs_bitset_get(&(local_50.data)->bs_columns[uVar4].data,local_50.row);
      return _Var2;
    }
    __assert_fail("info.data != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x912,
                  "_Bool ecs_is_component_enabled_w_entity(ecs_world_t *, ecs_entity_t, ecs_entity_t)"
                 );
  }
  __assert_fail("index >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x90f,
                "_Bool ecs_is_component_enabled_w_entity(ecs_world_t *, ecs_entity_t, ecs_entity_t)"
               );
}

Assistant:

bool ecs_is_component_enabled_w_entity(
    ecs_world_t *world,
    ecs_entity_t entity,
    ecs_entity_t component)
{
    ecs_entity_info_t info;
    ecs_table_t *table;
    if (!ecs_get_info(world, entity, &info) || !(table = info.table)) {
        return false;
    }

    ecs_entity_t bs_id = (component & ECS_COMPONENT_MASK) | ECS_DISABLED;

    ecs_type_t type = table->type;
    int32_t index = ecs_type_index_of(type, bs_id);
    if (index == -1) {
        /* If table does not have DISABLED column for component, component is
         * always enabled, if the entity has it */
        return ecs_has_entity(world, entity, component);
    }

    index -= table->bs_column_offset;
    ecs_assert(index >= 0, ECS_INTERNAL_ERROR, NULL);

    /* Data cannot be NULl, since entity is stored in the table */
    ecs_assert(info.data != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_bitset_t *bs = &info.data->bs_columns[index].data;  

    return ecs_bitset_get(bs, info.row);
}